

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkkDualRHS.cpp
# Opt level: O3

void __thiscall
HEkkDualRHS::chooseMultiGlobal
          (HEkkDualRHS *this,HighsInt *chIndex,HighsInt *chCount,HighsInt chLimit)

{
  double dVar1;
  double dVar2;
  HEkk *pHVar3;
  bool bVar4;
  HighsInt *pHVar5;
  HighsInt *pHVar6;
  bool bVar7;
  uint32_t uVar8;
  uint uVar9;
  ulong uVar10;
  ulong uVar11;
  uint uVar12;
  pair<double,_int> *ppVar13;
  int iVar14;
  uint uVar15;
  long lVar16;
  uint32_t uVar17;
  vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_> setP;
  uint32_t local_9c;
  vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_> local_98;
  uint local_74;
  size_type local_70;
  pair<double,_int> local_68;
  double local_58;
  undefined8 uStack_50;
  HighsInt *local_48;
  HighsInt *local_40;
  ulong local_38;
  
  uVar10 = (ulong)(uint)chLimit;
  HighsSimplexAnalysis::simplexTimerStart(this->analysis,0x26,0);
  if (0 < chLimit) {
    memset(chIndex,0xff,(ulong)(uint)chLimit << 2);
  }
  uVar11 = (ulong)(uint)(chLimit * 2);
  local_98.super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pair<double,_int> *)0x0;
  local_98.super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pair<double,_int> *)0x0;
  local_98.super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pair<double,_int> *)0x0;
  std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>::reserve
            (&local_98,uVar11);
  pHVar3 = this->ekk_instance_;
  uVar12 = this->workCount;
  local_70 = (size_type)chLimit;
  local_48 = chCount;
  local_40 = chIndex;
  local_38 = uVar10;
  if ((int)uVar12 < 0) {
    uVar9 = -uVar12;
    local_74 = 0;
    if (1 < uVar9) {
      uVar15 = 0x1f;
      if (~uVar12 != 0) {
        for (; ~uVar12 >> uVar15 == 0; uVar15 = uVar15 - 1) {
        }
      }
      local_74 = HighsRandom::drawUniform(&pHVar3->random_,uVar9,(uVar15 ^ 0xffffffe0) + 0x21);
    }
    local_58 = 0.0;
    uStack_50 = 0;
    bVar7 = true;
    do {
      bVar4 = bVar7;
      uVar15 = local_74;
      uVar12 = 0;
      if (bVar4) {
        uVar15 = uVar9;
        uVar12 = local_74;
      }
      if ((int)uVar12 < (int)uVar15) {
        lVar16 = (long)(int)uVar12;
        do {
          dVar1 = (this->work_infeasibility).super__Vector_base<double,_std::allocator<double>_>.
                  _M_impl.super__Vector_impl_data._M_start[lVar16];
          if ((1e-50 < dVar1) &&
             (dVar2 = (pHVar3->dual_edge_weight_).
                      super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start[lVar16], local_58 * dVar2 < dVar1)) {
            local_68.first = -dVar1 / dVar2;
            local_68.second = (int)lVar16;
            if (local_98.
                super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>
                ._M_impl.super__Vector_impl_data._M_finish ==
                local_98.
                super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage) {
              std::vector<std::pair<double,int>,std::allocator<std::pair<double,int>>>::
              _M_realloc_insert<std::pair<double,int>>
                        ((vector<std::pair<double,int>,std::allocator<std::pair<double,int>>> *)
                         &local_98,
                         (iterator)
                         local_98.
                         super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish,&local_68);
            }
            else {
              (local_98.
               super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>.
               _M_impl.super__Vector_impl_data._M_finish)->first = local_68.first;
              *(ulong *)&(local_98.
                          super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish)->second =
                   CONCAT44(local_68._12_4_,local_68.second);
              local_98.
              super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>.
              _M_impl.super__Vector_impl_data._M_finish =
                   local_98.
                   super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish + 1;
            }
            uVar10 = (long)local_98.
                           super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                     (long)local_98.
                           super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>
                           ._M_impl.super__Vector_impl_data._M_start >> 4;
            if (uVar11 <= uVar10) {
              if (local_98.
                  super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>
                  ._M_impl.super__Vector_impl_data._M_start !=
                  local_98.
                  super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish) {
                iVar14 = 0;
                if (1 < uVar10) {
                  iVar14 = 0;
                  do {
                    uVar10 = (long)uVar10 >> 1;
                    iVar14 = iVar14 + 1;
                  } while (1 < uVar10);
                }
                pdqsort_detail::
                pdqsort_loop<__gnu_cxx::__normal_iterator<std::pair<double,int>*,std::vector<std::pair<double,int>,std::allocator<std::pair<double,int>>>>,std::less<std::pair<double,int>>,false>
                          (local_98.
                           super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>
                           ._M_impl.super__Vector_impl_data._M_start,
                           local_98.
                           super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish,iVar14,1);
              }
              std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>::resize
                        (&local_98,local_70);
              local_58 = -local_98.
                          super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish[-1].first;
              uStack_50 = 0x8000000000000000;
            }
          }
          lVar16 = lVar16 + 1;
        } while (uVar15 != (uint)lVar16);
      }
      bVar7 = false;
    } while (bVar4);
  }
  else {
    local_9c = 0;
    if (1 < uVar12) {
      uVar9 = 0x1f;
      if (uVar12 - 1 != 0) {
        for (; uVar12 - 1 >> uVar9 == 0; uVar9 = uVar9 - 1) {
        }
      }
      local_9c = HighsRandom::drawUniform(&pHVar3->random_,uVar12,(uVar9 ^ 0xffffffe0) + 0x21);
    }
    local_58 = 0.0;
    uStack_50 = 0;
    bVar7 = true;
    do {
      bVar4 = bVar7;
      uVar17 = local_9c;
      uVar8 = 0;
      if (bVar4) {
        uVar17 = this->workCount;
        uVar8 = local_9c;
      }
      if ((int)uVar8 < (int)uVar17) {
        lVar16 = (long)(int)uVar8;
        do {
          iVar14 = (this->workIndex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start[lVar16];
          dVar1 = (this->work_infeasibility).super__Vector_base<double,_std::allocator<double>_>.
                  _M_impl.super__Vector_impl_data._M_start[iVar14];
          if ((1e-50 < dVar1) &&
             (dVar2 = (pHVar3->dual_edge_weight_).
                      super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start[iVar14], local_58 * dVar2 < dVar1)) {
            local_68.first = -dVar1 / dVar2;
            local_68.second = iVar14;
            if (local_98.
                super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>
                ._M_impl.super__Vector_impl_data._M_finish ==
                local_98.
                super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage) {
              std::vector<std::pair<double,int>,std::allocator<std::pair<double,int>>>::
              _M_realloc_insert<std::pair<double,int>>
                        ((vector<std::pair<double,int>,std::allocator<std::pair<double,int>>> *)
                         &local_98,
                         (iterator)
                         local_98.
                         super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish,&local_68);
            }
            else {
              (local_98.
               super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>.
               _M_impl.super__Vector_impl_data._M_finish)->first = local_68.first;
              *(ulong *)&(local_98.
                          super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish)->second =
                   CONCAT44(local_68._12_4_,iVar14);
              local_98.
              super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>.
              _M_impl.super__Vector_impl_data._M_finish =
                   local_98.
                   super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish + 1;
            }
            uVar10 = (long)local_98.
                           super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                     (long)local_98.
                           super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>
                           ._M_impl.super__Vector_impl_data._M_start >> 4;
            if (uVar11 <= uVar10) {
              if (local_98.
                  super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>
                  ._M_impl.super__Vector_impl_data._M_start !=
                  local_98.
                  super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish) {
                iVar14 = 0;
                if (1 < uVar10) {
                  iVar14 = 0;
                  do {
                    uVar10 = (long)uVar10 >> 1;
                    iVar14 = iVar14 + 1;
                  } while (1 < uVar10);
                }
                pdqsort_detail::
                pdqsort_loop<__gnu_cxx::__normal_iterator<std::pair<double,int>*,std::vector<std::pair<double,int>,std::allocator<std::pair<double,int>>>>,std::less<std::pair<double,int>>,false>
                          (local_98.
                           super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>
                           ._M_impl.super__Vector_impl_data._M_start,
                           local_98.
                           super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish,iVar14,1);
              }
              std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>::resize
                        (&local_98,local_70);
              local_58 = -local_98.
                          super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish[-1].first;
              uStack_50 = 0x8000000000000000;
            }
          }
          lVar16 = lVar16 + 1;
        } while (uVar17 != (uint32_t)lVar16);
      }
      bVar7 = false;
    } while (bVar4);
  }
  uVar10 = local_38;
  pHVar6 = local_40;
  pHVar5 = local_48;
  ppVar13 = local_98.
            super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if (local_98.super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>.
      _M_impl.super__Vector_impl_data._M_start !=
      local_98.super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    uVar11 = (long)local_98.
                   super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)local_98.
                   super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 4;
    iVar14 = 0;
    if (1 < uVar11) {
      iVar14 = 0;
      do {
        uVar11 = (long)uVar11 >> 1;
        iVar14 = iVar14 + 1;
      } while (1 < uVar11);
    }
    pdqsort_detail::
    pdqsort_loop<__gnu_cxx::__normal_iterator<std::pair<double,int>*,std::vector<std::pair<double,int>,std::allocator<std::pair<double,int>>>>,std::less<std::pair<double,int>>,false>
              (local_98.
               super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>.
               _M_impl.super__Vector_impl_data._M_start,
               local_98.
               super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>.
               _M_impl.super__Vector_impl_data._M_finish,iVar14,1);
    ppVar13 = local_98.
              super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>.
              _M_impl.super__Vector_impl_data._M_finish;
  }
  uVar11 = (long)ppVar13 -
           (long)local_98.
                 super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
  if ((int)uVar10 < (int)(uVar11 >> 4)) {
    std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>::resize
              (&local_98,local_70);
    uVar11 = (long)local_98.
                   super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)local_98.
                   super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
    ppVar13 = local_98.
              super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>.
              _M_impl.super__Vector_impl_data._M_finish;
  }
  *pHVar5 = (HighsInt)((long)uVar11 >> 4);
  if (ppVar13 !=
      local_98.super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>.
      _M_impl.super__Vector_impl_data._M_start) {
    uVar12 = 1;
    lVar16 = 0;
    do {
      *(int *)((long)pHVar6 + lVar16) =
           (&(local_98.
              super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>.
              _M_impl.super__Vector_impl_data._M_start)->second)[lVar16];
      uVar10 = (ulong)uVar12;
      lVar16 = lVar16 + 4;
      uVar12 = uVar12 + 1;
    } while (uVar10 < (ulong)((long)uVar11 >> 4));
  }
  HighsSimplexAnalysis::simplexTimerStop(this->analysis,0x26,0);
  if (local_98.super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pair<double,_int> *)0x0) {
    operator_delete(local_98.
                    super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void HEkkDualRHS::chooseMultiGlobal(HighsInt* chIndex, HighsInt* chCount,
                                    HighsInt chLimit) {
  analysis->simplexTimerStart(ChuzrDualClock);

  for (HighsInt i = 0; i < chLimit; i++) chIndex[i] = -1;

  const HighsUInt chooseCHECK = chLimit * 2;
  vector<pair<double, int>> setP;
  setP.reserve(chooseCHECK);

  std::vector<double>& edge_weight = ekk_instance_.dual_edge_weight_;
  if (workCount < 0) {
    // DENSE mode
    const HighsInt numRow = -workCount;
    HighsInt randomStart = ekk_instance_.random_.integer(numRow);
    double cutoffMerit = 0;
    // Now
    for (HighsInt section = 0; section < 2; section++) {
      const HighsInt start = (section == 0) ? randomStart : 0;
      const HighsInt end = (section == 0) ? numRow : randomStart;
      for (HighsInt iRow = start; iRow < end; iRow++) {
        // Was
        //    for (HighsInt iRow = 0; iRow < numRow; iRow++) {
        // Continue
        if (work_infeasibility[iRow] > kHighsZero) {
          const double myInfeas = work_infeasibility[iRow];
          const double myWeight = edge_weight[iRow];
          if (cutoffMerit * myWeight < myInfeas) {
            // Save
            setP.push_back(make_pair(-myInfeas / myWeight, iRow));
            // Shrink
            if (setP.size() >= chooseCHECK) {
              pdqsort(setP.begin(), setP.end());
              setP.resize(chLimit);
              cutoffMerit = -setP.back().first;
            }
          }
        }
      }
    }
  } else {
    // SPARSE Mode
    HighsInt randomStart;
    if (workCount) {
      randomStart = ekk_instance_.random_.integer(workCount);
    } else {
      // workCount = 0
      randomStart = 0;
    }
    double cutoffMerit = 0;
    // Now
    for (HighsInt section = 0; section < 2; section++) {
      const HighsInt start = (section == 0) ? randomStart : 0;
      const HighsInt end = (section == 0) ? workCount : randomStart;
      for (HighsInt i = start; i < end; i++) {
        // Was
        //    for (HighsInt i = 0; i < workCount; i++) {
        // Continue
        HighsInt iRow = workIndex[i];
        if (work_infeasibility[iRow] > kHighsZero) {
          const double myInfeas = work_infeasibility[iRow];
          const double myWeight = edge_weight[iRow];
          /*
          const double myMerit = myInfeas / myWeight;
          printf("CHUZR: iRow = %6" HIGHSINT_FORMAT "; Infeas = %11.4g; Weight =
          %11.4g; Merit = %11.4g\n", iRow, myInfeas, myWeight, myMerit);
          */
          if (cutoffMerit * myWeight < myInfeas) {
            // Save
            setP.push_back(make_pair(-myInfeas / myWeight, iRow));
            // Shrink
            if (setP.size() >= chooseCHECK) {
              pdqsort(setP.begin(), setP.end());
              setP.resize(chLimit);
              cutoffMerit = -setP.back().first;
            }
          }
        }
      }
    }
  }

  // Store the setP
  pdqsort(setP.begin(), setP.end());
  if ((HighsInt)(setP.size()) > chLimit) setP.resize(chLimit);
  *chCount = setP.size();
  for (unsigned i = 0; i < setP.size(); i++) chIndex[i] = setP[i].second;
  analysis->simplexTimerStop(ChuzrDualClock);
}